

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_da585::generateRandomFile
               (int channelCount,Compression compression,bool bulkWrite,bool relativeCoords,
               string *filename)

{
  uint uVar1;
  PixelType PVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  string *psVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  reference pvVar15;
  Array2D<void_*> *pAVar16;
  void **ppvVar17;
  Array2D<unsigned_int> *pAVar18;
  void *pvVar19;
  byte in_CL;
  byte in_DL;
  Compression in_ESI;
  int in_EDI;
  int k_4;
  int j_4;
  int i_7;
  int tx_1;
  int ty_1;
  int k_3;
  int x_3;
  int y_3;
  uint l_2;
  int k_2;
  int tx;
  int ty;
  int dwx_2;
  int dwy_2;
  int x_2;
  int y_2;
  Box2i box_2;
  int i_6;
  int j_3;
  uint l_1;
  int k_1;
  int dwx_1;
  int dwy_1;
  int x_1;
  int y_1;
  Box2i box_1;
  int i_5;
  int j_2;
  uint l;
  int k;
  int dwx;
  int dwy;
  int x;
  int y;
  Box2i box;
  int i_4;
  int j_1;
  Box2i dataWindowL;
  int lx;
  int ly;
  int pointerSize;
  int sampleSize;
  string str_1;
  stringstream ss_1;
  PixelType type_1;
  int i_3;
  int memOffset;
  int j;
  int i_2;
  Array2D<unsigned_int> sampleCount;
  int i_1;
  Array<Imf_3_2::Array2D<void_*>_> data;
  DeepFrameBuffer frameBuffer;
  DeepTiledOutputFile file;
  string str;
  stringstream ss;
  int type;
  int i;
  float in_stack_fffffffffffff52c;
  int in_stack_fffffffffffff534;
  undefined4 in_stack_fffffffffffff538;
  undefined4 in_stack_fffffffffffff53c;
  undefined4 in_stack_fffffffffffff540;
  undefined4 in_stack_fffffffffffff544;
  long in_stack_fffffffffffff548;
  DeepFrameBuffer *in_stack_fffffffffffff550;
  long in_stack_fffffffffffff588;
  Array<Imf_3_2::Array2D<void_*>_> *in_stack_fffffffffffff590;
  long in_stack_fffffffffffff5b0;
  long in_stack_fffffffffffff5b8;
  Array2D<Imf_3_2::Array2D<unsigned_int>_> *in_stack_fffffffffffff5c0;
  int local_608;
  int local_604;
  int local_600;
  int local_5f4;
  int local_5f0;
  int local_5ec;
  uint local_5e8;
  int local_5e4;
  int local_5d0;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  int local_5c0;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  uint local_5b0;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  int local_598;
  int local_594;
  int local_590;
  int local_58c;
  int local_588;
  int local_584;
  uint local_580;
  int local_57c;
  int local_578;
  int local_574;
  int local_570;
  int local_56c;
  int local_568;
  int local_564;
  int local_560;
  int local_55c;
  int local_558;
  int local_554;
  int local_550;
  int local_54c;
  int local_540;
  int local_53c;
  DeepSlice local_538 [56];
  int local_500;
  int local_4fc;
  DeepSlice local_4f8 [32];
  stringstream local_4d8 [16];
  undefined1 local_4c8 [376];
  PixelType local_350;
  int local_34c;
  Slice local_348 [60];
  int local_30c;
  int local_308;
  int local_304;
  Array2D<unsigned_int> local_300;
  int local_2e4;
  Array local_2e0 [16];
  Slice local_2d0 [104];
  undefined1 local_268 [32];
  Channel local_248 [16];
  Channel local_238 [16];
  Channel local_228 [16];
  Channel local_218 [32];
  stringstream local_1f8 [16];
  undefined1 local_1e8 [380];
  int local_6c;
  int local_68;
  Vec2<float> local_58;
  Header local_50 [70];
  byte local_a;
  byte local_9;
  Compression local_8;
  int local_4;
  
  local_9 = in_DL & 1;
  local_a = in_CL & 1;
  if ((local_a != 0) && (local_9 != 0)) {
    __assert_fail("bulkWrite == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x3c,
                  "void (anonymous namespace)::generateRandomFile(int, Compression, bool, bool, const std::string &)"
                 );
  }
  local_8 = in_ESI;
  local_4 = in_EDI;
  poVar9 = std::operator<<((ostream *)&std::cout,"generating ");
  std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
  Imath_3_2::Vec2<float>::Vec2(&local_58,0.0,0.0);
  Imf_3_2::Header::Header
            (local_50,(Box *)(anonymous_namespace)::displayWindow,
             (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&local_58,1.0,INCREASING_Y,
             local_8);
  Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,local_50);
  Imf_3_2::Header::~Header(local_50);
  poVar9 = std::operator<<((ostream *)&std::cout,"compression ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_8);
  poVar9 = std::operator<<(poVar9," ");
  std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1883cf);
  for (local_68 = 0; local_68 < local_4; local_68 = local_68 + 1) {
    local_6c = random_int(in_stack_fffffffffffff534);
    std::__cxx11::stringstream::stringstream(local_1f8);
    std::ostream::operator<<(local_1e8,local_68);
    std::__cxx11::stringstream::str();
    if (local_6c == 0) {
      psVar10 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_228,UINT,1,1,false);
      Imf_3_2::ChannelList::insert(psVar10,local_218);
    }
    if (local_6c == 1) {
      psVar10 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_238,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(psVar10,local_218);
    }
    if (local_6c == 2) {
      psVar10 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_248,FLOAT,1,1,false);
      Imf_3_2::ChannelList::insert(psVar10,local_218);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
               (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538)
              );
    std::__cxx11::string::~string((string *)local_218);
    std::__cxx11::stringstream::~stringstream(local_1f8);
  }
  Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
  iVar3 = random_int(in_stack_fffffffffffff534);
  iVar4 = random_int(in_stack_fffffffffffff534);
  Imf_3_2::TileDescription::TileDescription
            ((TileDescription *)(local_268 + 0x10),iVar3 + 1,iVar4 + 1,RIPMAP_LEVELS,ROUND_DOWN);
  Imf_3_2::Header::setTileDescription((TileDescription *)(anonymous_namespace)::header);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  remove(pcVar11);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  Imf_3_2::DeepTiledOutputFile::DeepTiledOutputFile
            ((DeepTiledOutputFile *)local_268,pcVar11,(Header *)(anonymous_namespace)::header,8);
  Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffff550);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array
            (in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  for (local_2e4 = 0; local_2e4 < local_4; local_2e4 = local_2e4 + 1) {
    Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
    Imf_3_2::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)in_stack_fffffffffffff550,in_stack_fffffffffffff548,
               CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
  }
  Imf_3_2::Array2D<unsigned_int>::Array2D(&local_300);
  Imf_3_2::Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)in_stack_fffffffffffff550,in_stack_fffffffffffff548,
             CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
  poVar9 = std::operator<<((ostream *)&std::cout," tileSizeX ");
  uVar5 = Imf_3_2::DeepTiledOutputFile::tileXSize();
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar5);
  poVar9 = std::operator<<(poVar9," tileSizeY ");
  uVar5 = Imf_3_2::DeepTiledOutputFile::tileYSize();
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar5);
  std::operator<<(poVar9," ");
  Imf_3_2::DeepTiledOutputFile::numYLevels();
  Imf_3_2::DeepTiledOutputFile::numXLevels();
  Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::resizeErase
            (in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
  for (local_304 = 0; lVar12 = (long)local_304,
      lVar13 = Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::height
                         ((Array2D<Imf_3_2::Array2D<unsigned_int>_> *)
                          (anonymous_namespace)::sampleCountWhole), lVar12 < lVar13;
      local_304 = local_304 + 1) {
    for (local_308 = 0; lVar12 = (long)local_308,
        lVar13 = Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::width
                           ((Array2D<Imf_3_2::Array2D<unsigned_int>_> *)
                            (anonymous_namespace)::sampleCountWhole), lVar12 < lVar13;
        local_308 = local_308 + 1) {
      Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::operator[]
                ((Array2D<Imf_3_2::Array2D<unsigned_int>_> *)(anonymous_namespace)::sampleCountWhole
                 ,(long)local_304);
      Imf_3_2::Array2D<unsigned_int>::resizeErase
                ((Array2D<unsigned_int> *)in_stack_fffffffffffff550,in_stack_fffffffffffff548,
                 CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
    }
  }
  if ((local_a & 1) == 0) {
    local_30c = (anonymous_namespace)::dataWindow + DAT_00281eb4 * 0x111;
  }
  else {
    local_30c = 0;
  }
  puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,0);
  uVar5 = local_a & 1;
  Imf_3_2::Slice::Slice
            (local_348,UINT,(char *)(puVar14 + -(long)local_30c),4,0x444,1,1,0.0,SUB41(uVar5,0),
             SUB41(uVar5,0));
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_2d0);
  for (local_34c = 0; local_34c < local_4; local_34c = local_34c + 1) {
    local_350 = NUM_PIXELTYPES;
    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                         (long)local_34c);
    if (*pvVar15 == 0) {
      local_350 = UINT;
    }
    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                         (long)local_34c);
    if (*pvVar15 == 1) {
      local_350 = HALF;
    }
    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                         (long)local_34c);
    if (*pvVar15 == 2) {
      local_350 = FLOAT;
    }
    std::__cxx11::stringstream::stringstream(local_4d8);
    std::ostream::operator<<(local_4c8,local_34c);
    std::__cxx11::stringstream::str();
    local_4fc = 0;
    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                         (long)local_34c);
    if (*pvVar15 == 0) {
      local_4fc = 4;
    }
    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                         (long)local_34c);
    if (*pvVar15 == 1) {
      local_4fc = 2;
    }
    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                         (long)local_34c);
    PVar2 = local_350;
    if (*pvVar15 == 2) {
      local_4fc = 4;
    }
    local_500 = 8;
    pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
    ppvVar17 = Imf_3_2::Array2D<void_*>::operator[](pAVar16 + local_34c,0);
    uVar5 = 1;
    Imf_3_2::DeepSlice::DeepSlice
              (local_538,PVar2,(char *)(ppvVar17 + -(long)local_30c),(long)local_500,
               (long)(local_500 * 0x111),(long)local_4fc,1,1,0.0,(bool)(local_a & 1),
               (bool)(local_a & 1));
    Imf_3_2::DeepFrameBuffer::insert((string *)local_2d0,local_4f8);
    std::__cxx11::string::~string((string *)local_4f8);
    std::__cxx11::stringstream::~stringstream(local_4d8);
  }
  Imf_3_2::DeepTiledOutputFile::setFrameBuffer((DeepFrameBuffer *)local_268);
  poVar9 = std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
  if ((local_9 & 1) == 0) {
    if ((local_a & 1) == 0) {
      poVar9 = std::operator<<((ostream *)&std::cout,"per-tile ");
      std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cout,"per-tile with relative coordinates ");
      std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
    }
  }
  else {
    poVar9 = std::operator<<((ostream *)&std::cout,"bulk ");
    std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
  }
  for (local_53c = 0; iVar3 = local_53c, iVar4 = Imf_3_2::DeepTiledOutputFile::numYLevels(),
      iVar3 < iVar4; local_53c = local_53c + 1) {
    for (local_540 = 0; iVar3 = local_540, iVar4 = Imf_3_2::DeepTiledOutputFile::numXLevels(),
        iVar3 < iVar4; local_540 = local_540 + 1) {
      Imf_3_2::DeepTiledOutputFile::dataWindowForLevel((int)&local_550,(int)local_268);
      if ((local_9 & 1) == 0) {
        if ((local_9 & 1) == 0) {
          if ((local_a & 1) == 0) {
            for (local_584 = 0; iVar3 = local_584,
                iVar4 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)local_268), iVar3 < iVar4;
                local_584 = local_584 + 1) {
              for (local_588 = 0; iVar3 = local_588,
                  iVar4 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)local_268), iVar3 < iVar4;
                  local_588 = local_588 + 1) {
                Imf_3_2::DeepTiledOutputFile::dataWindowForTile
                          ((int)&local_598,(int)local_268,local_588,local_584);
                for (local_59c = local_594; local_59c <= local_58c; local_59c = local_59c + 1) {
                  for (local_5a0 = local_598; local_5a0 <= local_590; local_5a0 = local_5a0 + 1) {
                    local_5a4 = local_59c - local_54c;
                    local_5a8 = local_5a0 - local_550;
                    iVar3 = random_int(in_stack_fffffffffffff534);
                    puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,(long)local_5a4)
                    ;
                    puVar14[local_5a8] = iVar3 + 1;
                    puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,(long)local_5a4)
                    ;
                    uVar1 = puVar14[local_5a8];
                    pAVar18 = Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::operator[]
                                        ((Array2D<Imf_3_2::Array2D<unsigned_int>_> *)
                                         (anonymous_namespace)::sampleCountWhole,(long)local_53c);
                    puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                        (pAVar18 + local_540,(long)local_5a4);
                    puVar14[local_5a8] = uVar1;
                    for (local_5ac = 0; local_5ac < local_4; local_5ac = local_5ac + 1) {
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,(long)local_5ac);
                      if (*pvVar15 == 0) {
                        puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                            (&local_300,(long)local_5a4);
                        pvVar19 = operator_new__((ulong)puVar14[local_5a8] << 2);
                        pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                        ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                             (pAVar16 + local_5ac,(long)local_5a4);
                        ppvVar17[local_5a8] = pvVar19;
                      }
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,(long)local_5ac);
                      if (*pvVar15 == 1) {
                        puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                            (&local_300,(long)local_5a4);
                        pvVar19 = operator_new__((ulong)puVar14[local_5a8] * 2);
                        pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                        ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                             (pAVar16 + local_5ac,(long)local_5a4);
                        ppvVar17[local_5a8] = pvVar19;
                      }
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,(long)local_5ac);
                      if (*pvVar15 == 2) {
                        puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                            (&local_300,(long)local_5a4);
                        pvVar19 = operator_new__((ulong)puVar14[local_5a8] << 2);
                        pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                        ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                             (pAVar16 + local_5ac,(long)local_5a4);
                        ppvVar17[local_5a8] = pvVar19;
                      }
                      for (local_5b0 = 0; uVar1 = local_5b0,
                          puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                              (&local_300,(long)local_5a4),
                          uVar1 < puVar14[local_5a8]; local_5b0 = local_5b0 + 1) {
                        pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)
                                             (anonymous_namespace)::channelTypes,(long)local_5ac);
                        if (*pvVar15 == 0) {
                          iVar3 = local_5a4 * 0x111 + local_5a8;
                          pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                          ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                               (pAVar16 + local_5ac,(long)local_5a4);
                          *(int *)((long)ppvVar17[local_5a8] + (ulong)local_5b0 * 4) = iVar3 % 0x801
                          ;
                        }
                        pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)
                                             (anonymous_namespace)::channelTypes,(long)local_5ac);
                        if (*pvVar15 == 1) {
                          pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                          Imf_3_2::Array2D<void_*>::operator[](pAVar16 + local_5ac,(long)local_5a4);
                          Imath_3_2::half::operator=
                                    ((half *)CONCAT44(in_stack_fffffffffffff534,uVar5),
                                     in_stack_fffffffffffff52c);
                        }
                        pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)
                                             (anonymous_namespace)::channelTypes,(long)local_5ac);
                        if (*pvVar15 == 2) {
                          iVar3 = local_5a4 * 0x111 + local_5a8;
                          pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                          ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                               (pAVar16 + local_5ac,(long)local_5a4);
                          *(float *)((long)ppvVar17[local_5a8] + (ulong)local_5b0 * 4) =
                               (float)(iVar3 % 0x801);
                        }
                      }
                    }
                  }
                }
                Imf_3_2::DeepTiledOutputFile::writeTile
                          ((int)local_268,local_588,local_584,local_540);
              }
            }
          }
          else if ((local_a & 1) != 0) {
            for (local_5b4 = 0; iVar3 = local_5b4,
                iVar4 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)local_268), iVar3 < iVar4;
                local_5b4 = local_5b4 + 1) {
              for (local_5b8 = 0; iVar3 = local_5b8,
                  iVar4 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)local_268), iVar3 < iVar4;
                  local_5b8 = local_5b8 + 1) {
                Imf_3_2::DeepTiledOutputFile::dataWindowForTile
                          ((int)&local_5c8,(int)local_268,local_5b8,local_5b4);
                for (local_5cc = local_5c4; local_5cc <= local_5bc; local_5cc = local_5cc + 1) {
                  for (local_5d0 = local_5c8; local_5d0 <= local_5c0; local_5d0 = local_5d0 + 1) {
                    iVar3 = local_5cc - local_54c;
                    iVar4 = local_5d0 - local_550;
                    iVar6 = local_5cc - local_5c4;
                    iVar7 = local_5d0 - local_5c8;
                    iVar8 = random_int(in_stack_fffffffffffff534);
                    puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,(long)iVar6);
                    puVar14[iVar7] = iVar8 + 1;
                    puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,(long)iVar6);
                    uVar1 = puVar14[iVar7];
                    pAVar18 = Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::operator[]
                                        ((Array2D<Imf_3_2::Array2D<unsigned_int>_> *)
                                         (anonymous_namespace)::sampleCountWhole,(long)local_53c);
                    puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                        (pAVar18 + local_540,(long)iVar3);
                    puVar14[iVar4] = uVar1;
                    for (local_5e4 = 0; local_5e4 < local_4; local_5e4 = local_5e4 + 1) {
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,(long)local_5e4);
                      if (*pvVar15 == 0) {
                        puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,(long)iVar6)
                        ;
                        pvVar19 = operator_new__((ulong)puVar14[iVar7] << 2);
                        pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                        ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                             (pAVar16 + local_5e4,(long)iVar6);
                        ppvVar17[iVar7] = pvVar19;
                      }
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,(long)local_5e4);
                      if (*pvVar15 == 1) {
                        puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,(long)iVar6)
                        ;
                        pvVar19 = operator_new__((ulong)puVar14[iVar7] * 2);
                        pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                        ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                             (pAVar16 + local_5e4,(long)iVar6);
                        ppvVar17[iVar7] = pvVar19;
                      }
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,(long)local_5e4);
                      if (*pvVar15 == 2) {
                        puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,(long)iVar6)
                        ;
                        pvVar19 = operator_new__((ulong)puVar14[iVar7] << 2);
                        pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                        ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                             (pAVar16 + local_5e4,(long)iVar6);
                        ppvVar17[iVar7] = pvVar19;
                      }
                      for (local_5e8 = 0;
                          puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                              (&local_300,(long)iVar6), local_5e8 < puVar14[iVar7];
                          local_5e8 = local_5e8 + 1) {
                        pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)
                                             (anonymous_namespace)::channelTypes,(long)local_5e4);
                        if (*pvVar15 == 0) {
                          pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                          ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                               (pAVar16 + local_5e4,(long)iVar6);
                          *(int *)((long)ppvVar17[iVar7] + (ulong)local_5e8 * 4) =
                               (iVar3 * 0x111 + iVar4) % 0x801;
                        }
                        pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)
                                             (anonymous_namespace)::channelTypes,(long)local_5e4);
                        if (*pvVar15 == 1) {
                          pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                          Imf_3_2::Array2D<void_*>::operator[](pAVar16 + local_5e4,(long)iVar6);
                          Imath_3_2::half::operator=
                                    ((half *)CONCAT44(in_stack_fffffffffffff534,uVar5),
                                     in_stack_fffffffffffff52c);
                        }
                        pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)
                                             (anonymous_namespace)::channelTypes,(long)local_5e4);
                        if (*pvVar15 == 2) {
                          pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                          ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                               (pAVar16 + local_5e4,(long)iVar6);
                          *(float *)((long)ppvVar17[iVar7] + (ulong)local_5e8 * 4) =
                               (float)((iVar3 * 0x111 + iVar4) % 0x801);
                        }
                      }
                    }
                  }
                }
                Imf_3_2::DeepTiledOutputFile::writeTile
                          ((int)local_268,local_5b8,local_5b4,local_540);
                for (local_5ec = local_5c4; local_5ec <= local_5bc; local_5ec = local_5ec + 1) {
                  for (local_5f0 = local_5c8; local_5f0 <= local_5c0; local_5f0 = local_5f0 + 1) {
                    for (local_5f4 = 0; local_5f4 < local_4; local_5f4 = local_5f4 + 1) {
                      iVar3 = local_5ec - local_5c4;
                      iVar4 = local_5f0 - local_5c8;
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,(long)local_5f4);
                      if (*pvVar15 == 0) {
                        pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                        ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                             (pAVar16 + local_5f4,(long)iVar3);
                        if (ppvVar17[iVar4] != (void *)0x0) {
                          operator_delete__(ppvVar17[iVar4]);
                        }
                      }
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,(long)local_5f4);
                      if (*pvVar15 == 1) {
                        pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                        ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                             (pAVar16 + local_5f4,(long)iVar3);
                        if (ppvVar17[iVar4] != (void *)0x0) {
                          operator_delete__(ppvVar17[iVar4]);
                        }
                      }
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,(long)local_5f4);
                      if (*pvVar15 == 2) {
                        pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                        ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                             (pAVar16 + local_5f4,(long)iVar3);
                        if (ppvVar17[iVar4] != (void *)0x0) {
                          operator_delete__(ppvVar17[iVar4]);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        for (local_554 = 0; iVar3 = local_554,
            iVar4 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)local_268), iVar3 < iVar4;
            local_554 = local_554 + 1) {
          for (local_558 = 0; iVar3 = local_558,
              iVar4 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)local_268), iVar3 < iVar4;
              local_558 = local_558 + 1) {
            Imf_3_2::DeepTiledOutputFile::dataWindowForTile
                      ((int)&local_568,(int)local_268,local_558,local_554);
            for (local_56c = local_564; local_56c <= local_55c; local_56c = local_56c + 1) {
              for (local_570 = local_568; local_570 <= local_560; local_570 = local_570 + 1) {
                local_574 = local_56c - local_54c;
                local_578 = local_570 - local_550;
                iVar3 = random_int(in_stack_fffffffffffff534);
                puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,(long)local_574);
                puVar14[local_578] = iVar3 + 1;
                puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,(long)local_574);
                uVar1 = puVar14[local_578];
                pAVar18 = Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::operator[]
                                    ((Array2D<Imf_3_2::Array2D<unsigned_int>_> *)
                                     (anonymous_namespace)::sampleCountWhole,(long)local_53c);
                puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                    (pAVar18 + local_540,(long)local_574);
                puVar14[local_578] = uVar1;
                for (local_57c = 0; local_57c < local_4; local_57c = local_57c + 1) {
                  pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_57c);
                  if (*pvVar15 == 0) {
                    puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,(long)local_574)
                    ;
                    pvVar19 = operator_new__((ulong)puVar14[local_578] << 2);
                    pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                    ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar16 + local_57c,(long)local_574);
                    ppvVar17[local_578] = pvVar19;
                  }
                  pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_57c);
                  if (*pvVar15 == 1) {
                    puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,(long)local_574)
                    ;
                    pvVar19 = operator_new__((ulong)puVar14[local_578] * 2);
                    pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                    ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar16 + local_57c,(long)local_574);
                    ppvVar17[local_578] = pvVar19;
                  }
                  pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_57c);
                  if (*pvVar15 == 2) {
                    puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[](&local_300,(long)local_574)
                    ;
                    pvVar19 = operator_new__((ulong)puVar14[local_578] << 2);
                    pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                    ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                         (pAVar16 + local_57c,(long)local_574);
                    ppvVar17[local_578] = pvVar19;
                  }
                  for (local_580 = 0; uVar1 = local_580,
                      puVar14 = Imf_3_2::Array2D<unsigned_int>::operator[]
                                          (&local_300,(long)local_574), uVar1 < puVar14[local_578];
                      local_580 = local_580 + 1) {
                    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)
                                         (anonymous_namespace)::channelTypes,(long)local_57c);
                    if (*pvVar15 == 0) {
                      iVar3 = local_574 * 0x111 + local_578;
                      pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                      ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                           (pAVar16 + local_57c,(long)local_574);
                      *(int *)((long)ppvVar17[local_578] + (ulong)local_580 * 4) = iVar3 % 0x801;
                    }
                    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)
                                         (anonymous_namespace)::channelTypes,(long)local_57c);
                    if (*pvVar15 == 1) {
                      pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                      Imf_3_2::Array2D<void_*>::operator[](pAVar16 + local_57c,(long)local_574);
                      Imath_3_2::half::operator=
                                ((half *)CONCAT44(in_stack_fffffffffffff534,uVar5),
                                 in_stack_fffffffffffff52c);
                    }
                    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)
                                         (anonymous_namespace)::channelTypes,(long)local_57c);
                    if (*pvVar15 == 2) {
                      iVar3 = local_574 * 0x111 + local_578;
                      pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                      ppvVar17 = Imf_3_2::Array2D<void_*>::operator[]
                                           (pAVar16 + local_57c,(long)local_574);
                      *(float *)((long)ppvVar17[local_578] + (ulong)local_580 * 4) =
                           (float)(iVar3 % 0x801);
                    }
                  }
                }
              }
            }
          }
        }
        iVar3 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)local_268);
        iVar4 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)local_268);
        Imf_3_2::DeepTiledOutputFile::writeTiles((int)local_268,0,iVar3 + -1,0,iVar4 + -1,local_540)
        ;
      }
      if ((local_a & 1) == 0) {
        for (local_600 = 0; iVar3 = Imf_3_2::DeepTiledOutputFile::levelHeight((int)local_268),
            local_600 < iVar3; local_600 = local_600 + 1) {
          for (local_604 = 0; iVar3 = Imf_3_2::DeepTiledOutputFile::levelWidth((int)local_268),
              local_604 < iVar3; local_604 = local_604 + 1) {
            for (local_608 = 0; local_608 < local_4; local_608 = local_608 + 1) {
              pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (anonymous_namespace)::channelTypes,(long)local_608);
              if (*pvVar15 == 0) {
                pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                ppvVar17 = Imf_3_2::Array2D<void_*>::operator[](pAVar16 + local_608,(long)local_600)
                ;
                if (ppvVar17[local_604] != (void *)0x0) {
                  operator_delete__(ppvVar17[local_604]);
                }
              }
              pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (anonymous_namespace)::channelTypes,(long)local_608);
              if (*pvVar15 == 1) {
                pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                ppvVar17 = Imf_3_2::Array2D<void_*>::operator[](pAVar16 + local_608,(long)local_600)
                ;
                if (ppvVar17[local_604] != (void *)0x0) {
                  operator_delete__(ppvVar17[local_604]);
                }
              }
              pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   (anonymous_namespace)::channelTypes,(long)local_608);
              if (*pvVar15 == 2) {
                pAVar16 = Imf_3_2::Array::operator_cast_to_Array2D_(local_2e0);
                ppvVar17 = Imf_3_2::Array2D<void_*>::operator[](pAVar16 + local_608,(long)local_600)
                ;
                in_stack_fffffffffffff550 = (DeepFrameBuffer *)ppvVar17[local_604];
                if (in_stack_fffffffffffff550 != (DeepFrameBuffer *)0x0) {
                  operator_delete__(in_stack_fffffffffffff550);
                }
              }
            }
          }
        }
      }
    }
  }
  Imf_3_2::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff534,uVar5));
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array
            ((Array<Imf_3_2::Array2D<void_*>_> *)in_stack_fffffffffffff550);
  Imf_3_2::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x18adcc);
  Imf_3_2::DeepTiledOutputFile::~DeepTiledOutputFile((DeepTiledOutputFile *)local_268);
  return;
}

Assistant:

void
generateRandomFile (
    int                channelCount,
    Compression        compression,
    bool               bulkWrite,
    bool               relativeCoords,
    const std::string& filename)
{
    if (relativeCoords) assert (bulkWrite == false);

    cout << "generating " << flush;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);
    cout << "compression " << compression << " " << flush;

    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int          type = random_int (3);
        stringstream ss;
        ss << i;
        string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPTILE);
    header.setTileDescription (TileDescription (
        random_int (width) + 1, random_int (height) + 1, RIPMAP_LEVELS));

    //
    // Set up the output file
    //
    remove (filename.c_str ());
    DeepTiledOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    Array2D<unsigned int> sampleCount;
    sampleCount.resizeErase (height, width);

    cout << " tileSizeX " << file.tileXSize () << " tileSizeY "
         << file.tileYSize () << " ";

    sampleCountWhole.resizeErase (file.numYLevels (), file.numXLevels ());
    for (int i = 0; i < sampleCountWhole.height (); i++)
        for (int j = 0; j < sampleCountWhole.width (); j++)
            sampleCountWhole[i][j].resizeErase (height, width);

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&sampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        stringstream ss;
        ss << i;
        string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    cout << "writing " << flush;

    if (bulkWrite)
        cout << "bulk " << flush;
    else
    {
        if (relativeCoords == false)
            cout << "per-tile " << flush;
        else
            cout << "per-tile with relative coordinates " << flush;
    }

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            if (bulkWrite)
            {
                //
                // Bulk write (without relative coordinates).
                //

                for (int j = 0; j < file.numYTiles (ly); j++)
                {
                    for (int i = 0; i < file.numXTiles (lx); i++)
                    {
                        Box2i box = file.dataWindowForTile (i, j, lx, ly);
                        for (int y = box.min.y; y <= box.max.y; y++)
                            for (int x = box.min.x; x <= box.max.x; x++)
                            {
                                int dwy               = y - dataWindowL.min.y;
                                int dwx               = x - dataWindowL.min.x;
                                sampleCount[dwy][dwx] = random_int (10) + 1;
                                sampleCountWhole[ly][lx][dwy][dwx] =
                                    sampleCount[dwy][dwx];
                                for (int k = 0; k < channelCount; k++)
                                {
                                    if (channelTypes[k] == 0)
                                        data[k][dwy][dwx] =
                                            new unsigned int[sampleCount[dwy]
                                                                        [dwx]];
                                    if (channelTypes[k] == 1)
                                        data[k][dwy][dwx] =
                                            new half[sampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 2)
                                        data[k][dwy][dwx] =
                                            new float[sampleCount[dwy][dwx]];
                                    for (unsigned int l = 0;
                                         l < sampleCount[dwy][dwx];
                                         l++)
                                    {
                                        if (channelTypes[k] == 0)
                                            ((unsigned int*)
                                                 data[k][dwy][dwx])[l] =
                                                (dwy * width + dwx) % 2049;
                                        if (channelTypes[k] == 1)
                                            ((half*) data[k][dwy][dwx])[l] =
                                                (dwy * width + dwx) % 2049;
                                        if (channelTypes[k] == 2)
                                            ((float*) data[k][dwy][dwx])[l] =
                                                (dwy * width + dwx) % 2049;
                                    }
                                }
                            }
                    }
                }

                file.writeTiles (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);
            }
            else if (bulkWrite == false)
            {
                if (relativeCoords == false)
                {
                    //
                    // Per-tile write without relative coordinates.
                    //

                    for (int j = 0; j < file.numYTiles (ly); j++)
                    {
                        for (int i = 0; i < file.numXTiles (lx); i++)
                        {
                            Box2i box = file.dataWindowForTile (i, j, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    sampleCount[dwy][dwx] = random_int (10) + 1;
                                    sampleCountWhole[ly][lx][dwy][dwx] =
                                        sampleCount[dwy][dwx];
                                    for (int k = 0; k < channelCount; k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][dwy][dwx] = new unsigned int
                                                [sampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 1)
                                            data[k][dwy][dwx] =
                                                new half[sampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 2)
                                            data[k][dwy][dwx] =
                                                new float[sampleCount[dwy]
                                                                     [dwx]];
                                        for (unsigned int l = 0;
                                             l < sampleCount[dwy][dwx];
                                             l++)
                                        {
                                            if (channelTypes[k] == 0)
                                                ((unsigned int*)
                                                     data[k][dwy][dwx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 1)
                                                ((half*) data[k][dwy][dwx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 2)
                                                ((float*)
                                                     data[k][dwy][dwx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                        }
                                    }
                                }
                            file.writeTile (i, j, lx, ly);
                        }
                    }
                }
                else if (relativeCoords)
                {
                    //
                    // Per-tile write with relative coordinates.
                    //

                    for (int j = 0; j < file.numYTiles (ly); j++)
                    {
                        for (int i = 0; i < file.numXTiles (lx); i++)
                        {
                            Box2i box = file.dataWindowForTile (i, j, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy             = y - dataWindowL.min.y;
                                    int dwx             = x - dataWindowL.min.x;
                                    int ty              = y - box.min.y;
                                    int tx              = x - box.min.x;
                                    sampleCount[ty][tx] = random_int (10) + 1;
                                    sampleCountWhole[ly][lx][dwy][dwx] =
                                        sampleCount[ty][tx];
                                    for (int k = 0; k < channelCount; k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][ty][tx] = new unsigned int
                                                [sampleCount[ty][tx]];
                                        if (channelTypes[k] == 1)
                                            data[k][ty][tx] =
                                                new half[sampleCount[ty][tx]];
                                        if (channelTypes[k] == 2)
                                            data[k][ty][tx] =
                                                new float[sampleCount[ty][tx]];
                                        for (unsigned int l = 0;
                                             l < sampleCount[ty][tx];
                                             l++)
                                        {
                                            if (channelTypes[k] == 0)
                                                ((unsigned int*)
                                                     data[k][ty][tx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 1)
                                                ((half*) data[k][ty][tx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 2)
                                                ((float*) data[k][ty][tx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                        }
                                    }
                                }
                            file.writeTile (i, j, lx, ly);

                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                    for (int k = 0; k < channelCount; k++)
                                    {
                                        int ty = y - box.min.y;
                                        int tx = x - box.min.x;
                                        if (channelTypes[k] == 0)
                                            delete[](unsigned int*)
                                                data[k][ty][tx];
                                        if (channelTypes[k] == 1)
                                            delete[](half*) data[k][ty][tx];
                                        if (channelTypes[k] == 2)
                                            delete[](float*) data[k][ty][tx];
                                    }
                        }
                    }
                }
            }

            if (relativeCoords == false)
            {
                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (channelTypes[k] == 0)
                                delete[](unsigned int*) data[k][i][j];
                            if (channelTypes[k] == 1)
                                delete[](half*) data[k][i][j];
                            if (channelTypes[k] == 2)
                                delete[](float*) data[k][i][j];
                        }
            }
        }
}